

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O3

void __thiscall gv_visitor::visit(gv_visitor *this,IntValue *ptr)

{
  stringstream local_1c8 [8];
  stringstream stream;
  ostream local_1b8 [112];
  ios_base local_148 [264];
  string local_40;
  
  std::__cxx11::stringstream::stringstream(local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1b8,"int: ",5);
  std::ostream::operator<<(local_1b8,ptr->value);
  std::__cxx11::stringbuf::str();
  box(this,ptr,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1c8);
  std::ios_base::~ios_base(local_148);
  return;
}

Assistant:

void gv_visitor::visit(IntValue* ptr) {
    std::stringstream stream;
    stream << "int: " << ptr->value;
    box(ptr, stream.str());
    //value(int)
}